

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>::rehash
          (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
           *this,size_t sizeHint)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QPalettePrivate *pQVar5;
  Entry *pEVar6;
  ulong uVar7;
  Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *pNVar8;
  ulong uVar9;
  size_t index;
  long lVar10;
  size_t numBuckets;
  Span *pSVar11;
  long lVar12;
  R RVar13;
  Bucket BVar14;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar10 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar13 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar13.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar2) {
    uVar9 = 0;
    pSVar11 = pSVar3;
    do {
      lVar10 = 0;
      do {
        bVar1 = pSVar11->offsets[lVar10];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar9].entries;
          uVar7 = this->seed ^ *(ulong *)pEVar4[bVar1].storage.data;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar14 = Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
                   ::findBucketWithHash<QWidget_const*>
                             ((Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>>
                               *)this,(QWidget **)(pEVar4 + bVar1),uVar7 >> 0x20 ^ uVar7);
          pNVar8 = Span<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
                   ::insert(BVar14.span,BVar14.index);
          pNVar8->key = *(QWidget **)pEVar4[bVar1].storage.data;
          pQVar5 = *(QPalettePrivate **)(pEVar4[bVar1].storage.data + 8);
          pEVar6 = pEVar4 + bVar1;
          (pEVar6->storage).data[8] = '\0';
          (pEVar6->storage).data[9] = '\0';
          (pEVar6->storage).data[10] = '\0';
          (pEVar6->storage).data[0xb] = '\0';
          (pEVar6->storage).data[0xc] = '\0';
          (pEVar6->storage).data[0xd] = '\0';
          (pEVar6->storage).data[0xe] = '\0';
          (pEVar6->storage).data[0xf] = '\0';
          (pNVar8->value).oldWidgetValue.d = pQVar5;
          (pNVar8->value).oldWidgetValue.currentGroup =
               *(ColorGroup *)(pEVar4[bVar1].storage.data + 0x10);
          (pNVar8->value).resolveMask = *(ResolveMask *)(pEVar4[bVar1].storage.data + 0x18);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>::
      freeData(pSVar3 + uVar9);
      uVar9 = uVar9 + 1;
      pSVar11 = pSVar11 + 1;
    } while (uVar9 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar10 = *(long *)&pSVar3[-1].allocated;
    if (lVar10 != 0) {
      lVar12 = lVar10 * 0x90;
      do {
        Span<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>::
        freeData((Span<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
                  *)(pSVar3[-1].offsets + lVar12));
        lVar12 = lVar12 + -0x90;
      } while (lVar12 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar10 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }